

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O2

Real __thiscall COLLADABU::Math::Quaternion::normalise(Quaternion *this)

{
  Real __x;
  double dVar1;
  
  __x = norm(this);
  if (__x < 0.0) {
    dVar1 = sqrt(__x);
  }
  else {
    dVar1 = SQRT(__x);
  }
  dVar1 = 1.0 / dVar1;
  this->w = this->w * dVar1;
  this->x = this->x * dVar1;
  this->y = this->y * dVar1;
  this->z = this->z * dVar1;
  return __x;
}

Assistant:

Real Quaternion::normalise( void )
        {
            Real len = norm();
            Real factor = 1.0f / sqrt( len );
            *this = *this * factor;
            return len;
        }